

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O2

SVGRadialGradientAttributes * __thiscall
lunasvg::SVGRadialGradientElement::collectGradientAttributes
          (SVGRadialGradientAttributes *__return_storage_ptr__,SVGRadialGradientElement *this)

{
  ElementID EVar1;
  bool bVar2;
  SVGGradientElement *pSVar3;
  size_type sVar4;
  SVGRadialGradientElement *element;
  SVGGradientElement *current;
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  processedGradients;
  
  __return_storage_ptr__->m_r = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_fx = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_cx = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_cy = (SVGRadialGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientUnits = (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientContentElement =
       (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientTransform =
       (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_spreadMethod = (SVGGradientElement *)0x0;
  __return_storage_ptr__->m_fy = (SVGRadialGradientElement *)0x0;
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &processedGradients._M_t._M_impl.super__Rb_tree_header._M_header;
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  current = &this->super_SVGGradientElement;
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       processedGradients._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    SVGGradientElement::collectGradientAttributes
              (current,&__return_storage_ptr__->super_SVGGradientAttributes);
    pSVar3 = current;
    if ((current->super_SVGPaintElement).super_SVGElement.m_id == RadialGradient) {
      if (__return_storage_ptr__->m_cx == (SVGRadialGradientElement *)0x0) {
        bVar2 = SVGElement::hasAttribute((SVGElement *)current,Cx);
        if (bVar2) {
          __return_storage_ptr__->m_cx = (SVGRadialGradientElement *)pSVar3;
        }
      }
      if (__return_storage_ptr__->m_cy == (SVGRadialGradientElement *)0x0) {
        bVar2 = SVGElement::hasAttribute((SVGElement *)pSVar3,Cy);
        if (bVar2) {
          __return_storage_ptr__->m_cy = (SVGRadialGradientElement *)pSVar3;
        }
      }
      if (__return_storage_ptr__->m_r == (SVGRadialGradientElement *)0x0) {
        bVar2 = SVGElement::hasAttribute((SVGElement *)pSVar3,R);
        if (bVar2) {
          __return_storage_ptr__->m_r = (SVGRadialGradientElement *)pSVar3;
        }
      }
      if (__return_storage_ptr__->m_fx == (SVGRadialGradientElement *)0x0) {
        bVar2 = SVGElement::hasAttribute((SVGElement *)pSVar3,Fx);
        if (bVar2) {
          __return_storage_ptr__->m_fx = (SVGRadialGradientElement *)pSVar3;
        }
      }
      if (__return_storage_ptr__->m_fy == (SVGRadialGradientElement *)0x0) {
        bVar2 = SVGElement::hasAttribute((SVGElement *)pSVar3,Fy);
        if (bVar2) {
          __return_storage_ptr__->m_fy = (SVGRadialGradientElement *)pSVar3;
        }
      }
    }
    pSVar3 = (SVGGradientElement *)
             SVGURIReference::getTargetElement
                       (&current->super_SVGURIReference,
                        (this->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.
                        super_SVGNode.m_document);
    if ((pSVar3 == (SVGGradientElement *)0x0) ||
       ((EVar1 = (pSVar3->super_SVGPaintElement).super_SVGElement.m_id, EVar1 != LinearGradient &&
        (EVar1 != RadialGradient)))) break;
    std::
    _Rb_tree<lunasvg::SVGGradientElement_const*,lunasvg::SVGGradientElement_const*,std::_Identity<lunasvg::SVGGradientElement_const*>,std::less<lunasvg::SVGGradientElement_const*>,std::allocator<lunasvg::SVGGradientElement_const*>>
    ::_M_insert_unique<lunasvg::SVGGradientElement_const*const&>
              ((_Rb_tree<lunasvg::SVGGradientElement_const*,lunasvg::SVGGradientElement_const*,std::_Identity<lunasvg::SVGGradientElement_const*>,std::less<lunasvg::SVGGradientElement_const*>,std::allocator<lunasvg::SVGGradientElement_const*>>
                *)&processedGradients,&current);
    current = pSVar3;
    sVar4 = std::
            set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
            ::count(&processedGradients,&current);
  } while (sVar4 == 0);
  SVGRadialGradientAttributes::setDefaultValues(__return_storage_ptr__,this);
  std::
  _Rb_tree<const_lunasvg::SVGGradientElement_*,_const_lunasvg::SVGGradientElement_*,_std::_Identity<const_lunasvg::SVGGradientElement_*>,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  ::~_Rb_tree(&processedGradients._M_t);
  return __return_storage_ptr__;
}

Assistant:

SVGRadialGradientAttributes SVGRadialGradientElement::collectGradientAttributes() const
{
    SVGRadialGradientAttributes attributes;
    std::set<const SVGGradientElement*> processedGradients;
    const SVGGradientElement* current = this;
    while(true) {
        current->collectGradientAttributes(attributes);
        if(current->id() == ElementID::RadialGradient) {
            auto element = static_cast<const SVGRadialGradientElement*>(current);
            if(!attributes.hasCx() && element->hasAttribute(PropertyID::Cx))
                attributes.setCx(element);
            if(!attributes.hasCy() && element->hasAttribute(PropertyID::Cy))
                attributes.setCy(element);
            if(!attributes.hasR() && element->hasAttribute(PropertyID::R))
                attributes.setR(element);
            if(!attributes.hasFx() && element->hasAttribute(PropertyID::Fx))
                attributes.setFx(element);
            if(!attributes.hasFy() && element->hasAttribute(PropertyID::Fy)) {
                attributes.setFy(element);
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || !(targetElement->id() == ElementID::LinearGradient || targetElement->id() == ElementID::RadialGradient))
            break;
        processedGradients.insert(current);
        current = static_cast<const SVGGradientElement*>(targetElement);
        if(processedGradients.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}